

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

MutAlgebraicCon __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
          (BasicProblem<mp::BasicProblemParams<int>_> *this,double lb,double ub)

{
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  *in_RDI;
  MutAlgebraicCon MVar1;
  size_t num_cons;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_ffffffffffffff18;
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  *this_00;
  AlgebraicConInfo local_b8;
  size_type local_30;
  undefined1 local_10 [12];
  
  this_00 = in_RDI + 0x17;
  local_30 = std::
             vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
             ::size(this_00);
  AlgebraicConInfo::AlgebraicConInfo(&local_b8,(double)this_00,(double)in_RDI);
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  ::push_back(in_RDI,(value_type *)in_stack_ffffffffffffff18);
  AlgebraicConInfo::~AlgebraicConInfo((AlgebraicConInfo *)0x447be3);
  MutAlgebraicCon::MutAlgebraicCon((MutAlgebraicCon *)in_RDI,in_stack_ffffffffffffff18,0);
  MVar1.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  MVar1.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)local_10._0_8_;
  MVar1.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = local_10._8_4_;
  return (MutAlgebraicCon)
         MVar1.
         super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutAlgebraicCon AddCon(double lb, double ub) {
    std::size_t num_cons = algebraic_cons_.size();
    MP_ASSERT(num_cons < MP_MAX_PROBLEM_ITEMS,
              "too many algebraic constraints");
    algebraic_cons_.push_back(AlgebraicConInfo(lb, ub));
    return MutAlgebraicCon(this, static_cast<int>(num_cons));
  }